

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaLoader::BuildLightsForNode
          (ColladaLoader *this,ColladaParser *pParser,Node *pNode,aiNode *pTarget)

{
  bool bVar1;
  Logger *this_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *this_01;
  basic_formatter *this_02;
  pointer ppVar2;
  aiLight *this_03;
  aiColor3D *paVar3;
  double dVar4;
  aiColor3D local_258;
  aiColor3D local_24c;
  aiColor3D local_240;
  aiColor3D local_234;
  aiColor3D local_228;
  aiVector3t<float> local_21c;
  aiLight *local_210;
  aiLight *out;
  Light *srcLight;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_78;
  _Self local_58;
  _Self local_50;
  const_iterator srcLightIt;
  LightInstance *lid;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Assimp::Collada::LightInstance,_std::allocator<Assimp::Collada::LightInstance>_> *__range1;
  aiNode *pTarget_local;
  Node *pNode_local;
  ColladaParser *pParser_local;
  ColladaLoader *this_local;
  
  __end1 = std::
           vector<Assimp::Collada::LightInstance,_std::allocator<Assimp::Collada::LightInstance>_>::
           begin(&pNode->mLights);
  lid = (LightInstance *)
        std::vector<Assimp::Collada::LightInstance,_std::allocator<Assimp::Collada::LightInstance>_>
        ::end(&pNode->mLights);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Assimp::Collada::LightInstance_*,_std::vector<Assimp::Collada::LightInstance,_std::allocator<Assimp::Collada::LightInstance>_>_>
                                     *)&lid), bVar1) {
    srcLightIt._M_node =
         (_Base_ptr)
         __gnu_cxx::
         __normal_iterator<const_Assimp::Collada::LightInstance_*,_std::vector<Assimp::Collada::LightInstance,_std::allocator<Assimp::Collada::LightInstance>_>_>
         ::operator*(&__end1);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Light,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Light>_>_>
         ::find(&pParser->mLightLibrary,(key_type *)srcLightIt._M_node);
    local_58._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Light,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Light>_>_>
         ::end(&pParser->mLightLibrary);
    bVar1 = std::operator==(&local_50,&local_58);
    if (bVar1) {
      this_00 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[39]>(&local_1f0,(char (*) [39])"Collada: Unable to find light for ID \"")
      ;
      this_01 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                          &local_1f0,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          srcLightIt._M_node);
      this_02 = (basic_formatter *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(this_01,(char (*) [13])"\". Skipping.");
      Formatter::basic_formatter::operator_cast_to_string(&local_78,this_02);
      Logger::warn(this_00,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_1f0);
    }
    else {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Light>_>
               ::operator->(&local_50);
      out = (aiLight *)&ppVar2->second;
      this_03 = (aiLight *)operator_new(0x46c);
      aiLight::aiLight(this_03);
      local_210 = this_03;
      aiString::operator=((aiString *)this_03,&pTarget->mName);
      local_210->mType = (out->mName).length;
      aiVector3t<float>::aiVector3t(&local_21c,0.0,0.0,-1.0);
      (local_210->mDirection).x = local_21c.x;
      (local_210->mDirection).y = local_21c.y;
      (local_210->mDirection).z = local_21c.z;
      local_210->mAttenuationConstant = *(float *)((out->mName).data + 0xc);
      local_210->mAttenuationLinear = *(float *)((out->mName).data + 0x10);
      local_210->mAttenuationQuadratic = *(float *)((out->mName).data + 0x14);
      aiColor3D::operator*(&local_228,*(ai_real *)((out->mName).data + 0x28));
      paVar3 = aiColor3D::operator=(&local_210->mColorAmbient,&local_228);
      paVar3 = aiColor3D::operator=(&local_210->mColorSpecular,paVar3);
      aiColor3D::operator=(&local_210->mColorDiffuse,paVar3);
      if (local_210->mType == aiLightSource_AMBIENT) {
        aiColor3D::aiColor3D(&local_234,0.0,0.0,0.0);
        paVar3 = aiColor3D::operator=(&local_210->mColorSpecular,&local_234);
        aiColor3D::operator=(&local_210->mColorDiffuse,paVar3);
        aiColor3D::operator*(&local_240,*(ai_real *)((out->mName).data + 0x28));
        aiColor3D::operator=(&local_210->mColorAmbient,&local_240);
      }
      else {
        aiColor3D::operator*(&local_24c,*(ai_real *)((out->mName).data + 0x28));
        paVar3 = aiColor3D::operator=(&local_210->mColorSpecular,&local_24c);
        aiColor3D::operator=(&local_210->mColorDiffuse,paVar3);
        aiColor3D::aiColor3D(&local_258,0.0,0.0,0.0);
        aiColor3D::operator=(&local_210->mColorAmbient,&local_258);
      }
      if (local_210->mType == aiLightSource_SPOT) {
        local_210->mAngleInnerCone = *(float *)((out->mName).data + 0x18) * 0.017453292;
        if (*(float *)((out->mName).data + 0x24) < 9.99999e+08) {
          local_210->mAngleOuterCone = *(float *)((out->mName).data + 0x24) * 0.017453292;
        }
        else if (*(float *)((out->mName).data + 0x20) < 9.99999e+08) {
          local_210->mAngleOuterCone =
               *(float *)((out->mName).data + 0x20) * 0.017453292 + local_210->mAngleInnerCone;
          if (local_210->mAngleOuterCone < local_210->mAngleInnerCone) {
            std::swap<float>(&local_210->mAngleInnerCone,&local_210->mAngleOuterCone);
          }
        }
        else {
          dVar4 = std::pow(5.12263046511523e-315,
                           (double)(ulong)(uint)(1.0 / *(float *)((out->mName).data + 0x1c)));
          dVar4 = std::acos(dVar4);
          local_210->mAngleOuterCone = SUB84(dVar4,0) + local_210->mAngleInnerCone;
        }
      }
      std::vector<aiLight_*,_std::allocator<aiLight_*>_>::push_back(&this->mLights,&local_210);
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::Collada::LightInstance_*,_std::vector<Assimp::Collada::LightInstance,_std::allocator<Assimp::Collada::LightInstance>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void ColladaLoader::BuildLightsForNode(const ColladaParser& pParser, const Collada::Node* pNode, aiNode* pTarget) {
    for (const Collada::LightInstance& lid : pNode->mLights) {
        // find the referred light
        ColladaParser::LightLibrary::const_iterator srcLightIt = pParser.mLightLibrary.find(lid.mLight);
        if (srcLightIt == pParser.mLightLibrary.end()) {
            ASSIMP_LOG_WARN_F("Collada: Unable to find light for ID \"", lid.mLight, "\". Skipping.");
            continue;
        }
        const Collada::Light* srcLight = &srcLightIt->second;

        // now fill our ai data structure
        aiLight* out = new aiLight();
        out->mName = pTarget->mName;
        out->mType = (aiLightSourceType)srcLight->mType;

        // collada lights point in -Z by default, rest is specified in node transform
        out->mDirection = aiVector3D(0.f, 0.f, -1.f);

        out->mAttenuationConstant = srcLight->mAttConstant;
        out->mAttenuationLinear = srcLight->mAttLinear;
        out->mAttenuationQuadratic = srcLight->mAttQuadratic;

        out->mColorDiffuse = out->mColorSpecular = out->mColorAmbient = srcLight->mColor*srcLight->mIntensity;
        if (out->mType == aiLightSource_AMBIENT) {
            out->mColorDiffuse = out->mColorSpecular = aiColor3D(0, 0, 0);
            out->mColorAmbient = srcLight->mColor*srcLight->mIntensity;
        }
        else {
            // collada doesn't differentiate between these color types
            out->mColorDiffuse = out->mColorSpecular = srcLight->mColor*srcLight->mIntensity;
            out->mColorAmbient = aiColor3D(0, 0, 0);
        }

        // convert falloff angle and falloff exponent in our representation, if given
        if (out->mType == aiLightSource_SPOT) {
            out->mAngleInnerCone = AI_DEG_TO_RAD(srcLight->mFalloffAngle);

            // ... some extension magic.
            if (srcLight->mOuterAngle >= ASSIMP_COLLADA_LIGHT_ANGLE_NOT_SET * (1 - 1e-6f)) {
                // ... some deprecation magic.
                if (srcLight->mPenumbraAngle >= ASSIMP_COLLADA_LIGHT_ANGLE_NOT_SET * (1 - 1e-6f)) {
                    // Need to rely on falloff_exponent. I don't know how to interpret it, so I need to guess ....
                    // epsilon chosen to be 0.1
                    out->mAngleOuterCone = std::acos(std::pow(0.1f, 1.f / srcLight->mFalloffExponent)) +
                        out->mAngleInnerCone;
                }
                else {
                    out->mAngleOuterCone = out->mAngleInnerCone + AI_DEG_TO_RAD(srcLight->mPenumbraAngle);
                    if (out->mAngleOuterCone < out->mAngleInnerCone)
                        std::swap(out->mAngleInnerCone, out->mAngleOuterCone);
                }
            }
            else {
                out->mAngleOuterCone = AI_DEG_TO_RAD(srcLight->mOuterAngle);
            }
        }

        // add to light list
        mLights.push_back(out);
    }
}